

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

hbtrie_result hbtrie_iterator_free(hbtrie_iterator *it)

{
  btree_iterator *pbVar1;
  btree_iterator *it_00;
  long in_RDI;
  btreeit_item *item;
  list_elem *e;
  
  it_00 = (btree_iterator *)list_begin((list *)(in_RDI + 0x70));
  while (it_00 != (btree_iterator *)0x0) {
    pbVar1 = it_00 + -2;
    it_00 = (btree_iterator *)list_remove((list *)(in_RDI + 0x70),(list_elem *)it_00);
    btree_iterator_free(it_00);
    free(&pbVar1->flags);
  }
  free(*(void **)(in_RDI + 0x68));
  if (*(long *)(in_RDI + 0x80) != 0) {
    free(*(void **)(in_RDI + 0x80));
  }
  return HBTRIE_RESULT_SUCCESS;
}

Assistant:

hbtrie_result hbtrie_iterator_free(struct hbtrie_iterator *it)
{
    struct list_elem *e;
    struct btreeit_item *item;
    e = list_begin(&it->btreeit_list);
    while(e){
        item = _get_entry(e, struct btreeit_item, le);
        e = list_remove(&it->btreeit_list, e);
        btree_iterator_free(&item->btree_it);
        mempool_free(item);
    }
    free(it->trie.last_map_chunk);
    if (it->curkey) free(it->curkey);
    return HBTRIE_RESULT_SUCCESS;
}